

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O0

TType * __thiscall glslang::TAnonMember::getWritableType(TAnonMember *this)

{
  int iVar1;
  undefined4 extraout_var;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_00;
  const_reference pvVar2;
  TTypeList *types;
  TAnonMember *this_local;
  
  if (((this->super_TSymbol).writable & 1U) != 0) {
    iVar1 = (*(this->anonContainer->super_TSymbol)._vptr_TSymbol[0xc])();
    this_00 = &TType::getStruct((TType *)CONCAT44(extraout_var,iVar1))->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    pvVar2 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::operator[]
                       (this_00,(ulong)this->memberNumber);
    return pvVar2->type;
  }
  __assert_fail("writable",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SymbolTable.h"
                ,0x181,"virtual TType &glslang::TAnonMember::getWritableType()");
}

Assistant:

virtual TType& getWritableType() override
    {
        assert(writable);
        const TTypeList& types = *anonContainer.getType().getStruct();
        return *types[memberNumber].type;
    }